

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O2

void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *p,int nSupersMax)

{
  Map_Super_t **ppMVar1;
  Map_HashEntry_t *pMVar2;
  long *__ptr;
  Map_Super_t **ppMVar3;
  Map_Super_t *pMVar4;
  size_t sVar5;
  long lVar6;
  Map_HashEntry_t **ppMVar7;
  size_t __nmemb;
  uint uVar8;
  
  __ptr = (long *)malloc((long)nSupersMax << 3);
  lVar6 = 0;
  do {
    if (p->nBins <= lVar6) {
      free(__ptr);
      return;
    }
    ppMVar7 = p->pBins + lVar6;
    while (pMVar2 = *ppMVar7, pMVar2 != (Map_HashEntry_t *)0x0) {
      ppMVar1 = &pMVar2->pGates;
      uVar8 = 0;
      __nmemb = 0;
      ppMVar3 = ppMVar1;
      while( true ) {
        pMVar4 = *ppMVar3;
        if (pMVar4 == (Map_Super_t *)0x0) break;
        __ptr[__nmemb] = (long)pMVar4;
        __nmemb = __nmemb + 1;
        ppMVar3 = &pMVar4->pNext;
        uVar8 = uVar8 + 0x1000;
      }
      *ppMVar1 = (Map_Super_t *)0x0;
      if (__nmemb != 0) {
        qsort(__ptr,__nmemb,8,Map_SuperTableCompareGatesInList);
        if (*(float *)(*__ptr + 0xec) <= *(float *)(__ptr[__nmemb - 1] + 0xec) &&
            *(float *)(__ptr[__nmemb - 1] + 0xec) != *(float *)(*__ptr + 0xec)) {
          __assert_fail("Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                        ,0x184,"void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *, int)");
        }
        pMVar4 = *ppMVar1;
        for (sVar5 = 0; __nmemb != sVar5; sVar5 = sVar5 + 1) {
          *(Map_Super_t **)(__ptr[sVar5] + 0xf8) = pMVar4;
          pMVar4 = (Map_Super_t *)__ptr[sVar5];
          *ppMVar1 = pMVar4;
        }
        *(uint *)&pMVar4->field_0x4 = *(uint *)&pMVar4->field_0x4 & 0xf0000fff | uVar8 & 0xffff000;
      }
      ppMVar7 = &pMVar2->pNext;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Map_SuperTableSortSupergatesByDelay( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i, k;

    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
        {
            // collect the gates in this entry
            nSupers = 0;
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
            {
                // skip supergates, whose root is the AND gate
//                if ( strcmp( Mio_GateReadName(pSuper->pRoot), "and" ) == 0 )
//                    continue;
                ppSupers[nSupers++] = pSuper;
            }
            pEnt->pGates = NULL;
            if ( nSupers == 0 )
                continue;
            // sort the gates by delay
            qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
                    (int (*)(const void *, const void *)) Map_SuperTableCompareGatesInList );
            assert( Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0 );
            // link them in the reverse order
            for ( k = 0; k < nSupers; k++ )
            {
                ppSupers[k]->pNext = pEnt->pGates;
                pEnt->pGates = ppSupers[k];
            }
            // save the number of supergates in the list
            pEnt->pGates->nSupers = nSupers;
        }
    ABC_FREE( ppSupers );
}